

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwen2vl-cli.cpp
# Opt level: O2

bool eval_tokens(llama_context *ctx_llama,vector<int,_std::allocator<int>_> *tokens,int n_batch,
                int *n_past,int *st_pos_id)

{
  llama_pos *plVar1;
  undefined1 extraout_AL;
  int iVar2;
  ulong uVar3;
  common_log *log;
  pointer piVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int8_t *piVar12;
  vector<int,_std::allocator<int>_> pos;
  llama_batch batch;
  
  uVar3 = (ulong)((long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar7 = 0;
  do {
    if ((long)(int)uVar3 <= (long)uVar7) {
LAB_00134b82:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&pos.super__Vector_base<int,_std::allocator<int>_>);
      return (bool)extraout_AL;
    }
    piVar4 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    iVar6 = (int)((ulong)((long)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar4) >> 2) - (int)uVar7
    ;
    if (n_batch <= iVar6) {
      iVar6 = n_batch;
    }
    llama_batch_get_one(&batch,piVar4 + uVar7,iVar6);
    std::vector<int,_std::allocator<int>_>::resize(&pos,(long)batch.n_tokens << 2);
    for (piVar4 = pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar4 != pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish; piVar4 = piVar4 + 1) {
      *piVar4 = 0;
    }
    for (uVar5 = 0; (long)uVar5 < (long)batch.n_tokens * 3; uVar5 = uVar5 + 1) {
      pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar5] = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                     (long)batch.n_tokens) + *st_pos_id;
    }
    batch.pos = pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
    plVar1 = batch.pos;
    batch.pos._0_4_ =
         SUB84(pos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,0);
    uVar8 = batch.embd._0_4_;
    uVar9 = batch.pos._0_4_;
    uVar10 = batch.n_seq_id._0_4_;
    uVar11 = batch.seq_id._0_4_;
    piVar12 = batch.logits;
    batch.pos = plVar1;
    iVar2 = llama_decode(ctx_llama);
    if (iVar2 != 0) {
      if (-1 < common_log_verbosity_thold) {
        log = common_log_main();
        common_log_add(log,GGML_LOG_LEVEL_ERROR,
                       "%s : failed to eval. token %d/%d (batch size %d, n_past %d)\n","eval_tokens"
                       ,uVar7 & 0xffffffff,uVar3,n_batch,*n_past,uVar8,uVar9,uVar10,uVar11,piVar12);
      }
      goto LAB_00134b82;
    }
    *n_past = *n_past + iVar6;
    *st_pos_id = *st_pos_id + iVar6;
    uVar7 = uVar7 + (long)n_batch;
  } while( true );
}

Assistant:

static bool eval_tokens(struct llama_context * ctx_llama, std::vector<llama_token> tokens, int n_batch, int * n_past, int * st_pos_id) {
    int N = (int) tokens.size();
    std::vector<llama_pos> pos;
    for (int i = 0; i < N; i += n_batch) {
        int n_eval = (int) tokens.size() - i;
        if (n_eval > n_batch) {
            n_eval = n_batch;
        }
        auto batch = llama_batch_get_one(&tokens[i], n_eval);
        // TODO: add mrope pos ids somewhere else
        pos.resize(batch.n_tokens * 4);
        std::fill(pos.begin(), pos.end(), 0);
        for (int j = 0; j < batch.n_tokens * 3; j ++) {
            pos[j] = *st_pos_id + (j % batch.n_tokens);
        }
        batch.pos = pos.data();

        if (llama_decode(ctx_llama, batch)) {
            LOG_ERR("%s : failed to eval. token %d/%d (batch size %d, n_past %d)\n", __func__, i, N, n_batch, *n_past);
            return false;
        }
        *n_past += n_eval;
        *st_pos_id += n_eval;
    }
    return true;
}